

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::auto_scope::auto_scope
          (auto_scope *this,impl *parent,object_ptr *act,scope_ptr *prev)

{
  gc_heap *args;
  undefined1 local_38 [24];
  scope_ptr *prev_local;
  object_ptr *act_local;
  impl *parent_local;
  auto_scope *this_local;
  
  this->parent = parent;
  local_38._16_8_ = prev;
  prev_local = (scope_ptr *)act;
  act_local = (object_ptr *)parent;
  parent_local = (impl *)this;
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr(&this->old_scopes,&parent->active_scope_);
  args = gc_heap_ptr_untyped::heap(&prev_local->super_gc_heap_ptr_untyped);
  gc_heap::
  make<mjs::interpreter::impl::scope,mjs::gc_heap_ptr<mjs::object>const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&>
            ((gc_heap *)local_38,(gc_heap_ptr<mjs::object> *)args,prev_local);
  gc_heap_ptr<mjs::interpreter::impl::scope>::operator=
            ((gc_heap_ptr<mjs::interpreter::impl::scope> *)(act_local + 1),
             (gc_heap_ptr<mjs::interpreter::impl::scope> *)local_38);
  gc_heap_ptr<mjs::interpreter::impl::scope>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::interpreter::impl::scope> *)local_38);
  return;
}

Assistant:

explicit auto_scope(impl& parent, const object_ptr& act, const scope_ptr& prev) : parent(parent), old_scopes(parent.active_scope_) {
            parent.active_scope_ = act.heap().make<scope>(act, prev);
        }